

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::reserve
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this,size_t n)

{
  memory_resource *pmVar1;
  float *pfVar2;
  size_t sVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t sVar6;
  float *pfVar5;
  
  if (n <= this->nAlloc) {
    return;
  }
  if (n * 4 == 0) {
    pfVar5 = (float *)0x0;
  }
  else {
    pmVar1 = (this->alloc).memoryResource;
    iVar4 = (*pmVar1->_vptr_memory_resource[2])(pmVar1,n * 4,4);
    pfVar5 = (float *)CONCAT44(extraout_var,iVar4);
  }
  pfVar2 = this->ptr;
  sVar3 = this->nStored;
  if (sVar3 == 0) {
    if (pfVar2 == (float *)0x0) goto LAB_0020444f;
  }
  else {
    sVar6 = 0;
    do {
      pfVar5[sVar6] = pfVar2[sVar6];
      sVar6 = sVar6 + 1;
    } while (sVar3 != sVar6);
  }
  pmVar1 = (this->alloc).memoryResource;
  (*pmVar1->_vptr_memory_resource[3])(pmVar1,pfVar2,this->nAlloc << 2,4);
LAB_0020444f:
  this->nAlloc = n;
  this->ptr = pfVar5;
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }